

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * IR::Instr::CloneRange
                  (Instr *instrStart,Instr *instrLast,Instr *instrAfter,Lowerer *lowerer,
                  JitArenaAllocator *alloc,_func_bool_Instr_ptr *fMapTest,
                  bool clonedInstrGetOrigArgSlotSym)

{
  Func *this;
  code *pcVar1;
  undefined4 *puVar2;
  bool bVar3;
  Instr *instr;
  LabelInstr *instr_00;
  Instr *pIVar4;
  Instr *pIVar5;
  LabelInstr *local_60;
  _func_bool_Instr_ptr *local_58;
  undefined4 *local_50;
  Instr *local_48;
  Func *local_40;
  Instr *local_38;
  
  this = instrStart->m_func->topFunc;
  local_58 = fMapTest;
  Func::BeginClone(this,lowerer,alloc);
  this->topFunc->m_cloner->clonedInstrGetOrigArgSlotSym = clonedInstrGetOrigArgSlotSym;
  if (instrLast == (Instr *)0x0) {
    pIVar5 = (Instr *)0x0;
  }
  else {
    pIVar5 = instrLast->m_next;
  }
  local_40 = this;
  local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pIVar4 = (Instr *)0x0;
  local_48 = instrAfter;
  do {
    local_38 = instrStart;
    if (instrStart == pIVar5) {
      Func::EndClone(local_40);
      return local_48;
    }
    if ((pIVar4 != (Instr *)0x0) && (pIVar4->m_next != instrStart)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = local_50;
      *local_50 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x2bd,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                         ,"Modifying instr list but not using EDITING iterator!");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar2 = 0;
    }
    pIVar4 = local_38;
    instr = Clone(local_38);
    InsertAfter(instrAfter,instr);
    local_38->field_0x38 = local_38->field_0x38 | 8;
    bVar3 = (*local_58)(instr);
    if (bVar3) {
      instr_00 = LabelInstr::New(Label,local_38->m_func,false);
      InsertBefore(instr,&instr_00->super_Instr);
      local_60 = instr_00;
      JsUtil::
      BaseDictionary<IR::Instr*,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<IR::Instr*,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                ((BaseDictionary<IR::Instr*,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)local_40->topFunc->m_cloneMap,&local_38,(Instr **)&local_60);
    }
    instrStart = local_38->m_next;
    instrAfter = instr;
  } while( true );
}

Assistant:

Instr *
Instr::CloneRange(
    Instr * instrStart, Instr * instrLast, Instr * instrAfter, Lowerer *lowerer, JitArenaAllocator * alloc, bool (*fMapTest)(IR::Instr*), bool clonedInstrGetOrigArgSlotSym)
{
    IR::Instr * instrReturn = instrAfter;

    Func * topFunc = instrStart->m_func->GetTopFunc();
    topFunc->BeginClone(lowerer, alloc);
    topFunc->GetCloner()->clonedInstrGetOrigArgSlotSym = clonedInstrGetOrigArgSlotSym;

    FOREACH_INSTR_IN_RANGE(instr, instrStart, instrLast)
    {
        Instr * instrClone = instr->Clone();
        instrAfter->InsertAfter(instrClone);
        instrAfter = instrClone;
        instr->isCloned = true;
        if (fMapTest(instrClone))
        {
            IR::LabelInstr *instrLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
            instrClone->InsertBefore(instrLabel);
            topFunc->GetCloneMap()->Item(instr, instrLabel);
        }
    }
    NEXT_INSTR_IN_RANGE;

    topFunc->EndClone();

    return instrReturn;
}